

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageLevel.cpp
# Opt level: O0

void __thiscall
Imf_2_5::DeepImageLevel::moveSamplesToNewBuffer
          (DeepImageLevel *this,uint *oldNumSamples,uint *newNumSamples,
          size_t *newSampleListPositions)

{
  bool bVar1;
  iterator this_00;
  pointer ppVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DeepImageChannel_*>_>_>
  *in_RDI;
  iterator j;
  _Self local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DeepImageChannel_*>_>_>
       ::begin(in_RDI);
  while( true ) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DeepImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DeepImageChannel_*>_>_>
              ::end(in_RDI);
    bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DeepImageChannel_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DeepImageChannel_*>_>
                           *)this_00._M_node);
    (*(ppVar2->second->super_ImageChannel)._vptr_ImageChannel[7])
              (ppVar2->second,local_10,local_18,local_20);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DeepImageChannel_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::DeepImageChannel_*>_>
                  *)this_00._M_node);
  }
  return;
}

Assistant:

void
DeepImageLevel::moveSamplesToNewBuffer
    (const unsigned int * oldNumSamples,
     const unsigned int * newNumSamples,
     const size_t * newSampleListPositions)
{
    for (ChannelMap::iterator j = _channels.begin(); j != _channels.end(); ++j)
    {
        j->second->moveSamplesToNewBuffer (oldNumSamples,
                                           newNumSamples,
                                           newSampleListPositions);
    }
}